

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.c
# Opt level: O2

Color trace_ray(Scene *sc,Ray r,int depth,Sampler *sampler)

{
  Object obj;
  long lVar1;
  int i;
  ulong uVar2;
  undefined8 *puVar3;
  Intersect *pIVar4;
  undefined8 *puVar5;
  long lVar6;
  byte bVar7;
  float fVar8;
  Color CVar11;
  Intersect in_stack_ffffffffffffff08;
  Material *in_stack_ffffffffffffff58;
  Intersect it;
  float fVar9;
  float fVar10;
  
  bVar7 = 0;
  it.hit = false;
  it.t = INFINITY;
  it.depth = depth;
  it.sampler = sampler;
  sampler->current_depth = (long)depth;
  lVar6 = 0;
  for (uVar2 = 0; uVar2 < sc->object_count; uVar2 = uVar2 + 1) {
    puVar3 = (undefined8 *)((long)&sc->objects->kind + lVar6);
    puVar5 = (undefined8 *)&stack0xffffffffffffff08;
    for (lVar1 = 0xb; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar5 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    }
    obj.material = in_stack_ffffffffffffff58;
    obj._0_80_ = in_stack_ffffffffffffff08;
    intersect_object(obj,r,&it);
    lVar6 = lVar6 + 0x58;
  }
  if (it.hit == false) {
    CVar11 = gray(0.0);
    fVar10 = CVar11.b;
    fVar8 = CVar11.r;
    fVar9 = CVar11.g;
  }
  else {
    pIVar4 = &it;
    puVar3 = (undefined8 *)&stack0xffffffffffffff08;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar3 = *(undefined8 *)pIVar4;
      pIVar4 = (Intersect *)((long)pIVar4 + (ulong)bVar7 * -0x10 + 8);
      puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
    }
    CVar11 = shade(in_stack_ffffffffffffff08,sc);
    fVar10 = CVar11.b;
    fVar8 = CVar11.r;
    fVar9 = CVar11.g;
  }
  CVar11.g = fVar9;
  CVar11.r = fVar8;
  CVar11.b = fVar10;
  return CVar11;
}

Assistant:

Color trace_ray(Scene* sc, Ray r, int depth, Sampler* sampler) {
    Intersect it;
    it.hit = false;
    it.t = INFINITY;
    it.depth = depth;
    it.sampler = sampler;
    sampler->current_depth = depth;

    for (int i = 0; i < sc->object_count; i++) {
        intersect_object(sc->objects[i], r, &it);
    }

    Color rval;

    if (it.hit) {
        rval = shade(it, sc);
    } else {
        rval = gray(0.0f); // @Todo : color constants
    }
    return rval;
}